

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hlslGrammar.cpp
# Opt level: O0

bool __thiscall glslang::HlslGrammar::acceptStatement(HlslGrammar *this,TIntermNode **statement)

{
  EHlslTokenClass EVar1;
  undefined1 local_40 [8];
  TAttributes attributes;
  TIntermNode **statement_local;
  HlslGrammar *this_local;
  
  *statement = (TIntermNode *)0x0;
  attributes.super_list<glslang::TAttributeArgs,_glslang::pool_allocator<glslang::TAttributeArgs>_>.
  super__List_base<glslang::TAttributeArgs,_glslang::pool_allocator<glslang::TAttributeArgs>_>.
  _M_impl._M_node._M_size = (size_t)statement;
  TList<glslang::TAttributeArgs>::TList((TList<glslang::TAttributeArgs> *)local_40);
  acceptAttributes(this,(TList<glslang::TAttributeArgs> *)local_40);
  EVar1 = HlslTokenStream::peek(&this->super_HlslTokenStream);
  switch(EVar1) {
  case EHTokFor:
  case EHTokDo:
  case EHTokWhile:
    this_local._7_1_ =
         acceptIterationStatement
                   (this,(TIntermNode **)
                         attributes.
                         super_list<glslang::TAttributeArgs,_glslang::pool_allocator<glslang::TAttributeArgs>_>
                         .
                         super__List_base<glslang::TAttributeArgs,_glslang::pool_allocator<glslang::TAttributeArgs>_>
                         ._M_impl._M_node._M_size,(TAttributes *)local_40);
    break;
  case EHTokBreak:
  case EHTokContinue:
  case EHTokDiscard:
  case EHTokReturn:
    this_local._7_1_ =
         acceptJumpStatement(this,(TIntermNode **)
                                  attributes.
                                  super_list<glslang::TAttributeArgs,_glslang::pool_allocator<glslang::TAttributeArgs>_>
                                  .
                                  super__List_base<glslang::TAttributeArgs,_glslang::pool_allocator<glslang::TAttributeArgs>_>
                                  ._M_impl._M_node._M_size);
    break;
  case EHTokIf:
    this_local._7_1_ =
         acceptSelectionStatement
                   (this,(TIntermNode **)
                         attributes.
                         super_list<glslang::TAttributeArgs,_glslang::pool_allocator<glslang::TAttributeArgs>_>
                         .
                         super__List_base<glslang::TAttributeArgs,_glslang::pool_allocator<glslang::TAttributeArgs>_>
                         ._M_impl._M_node._M_size,(TAttributes *)local_40);
    break;
  default:
    this_local._7_1_ =
         acceptSimpleStatement
                   (this,(TIntermNode **)
                         attributes.
                         super_list<glslang::TAttributeArgs,_glslang::pool_allocator<glslang::TAttributeArgs>_>
                         .
                         super__List_base<glslang::TAttributeArgs,_glslang::pool_allocator<glslang::TAttributeArgs>_>
                         ._M_impl._M_node._M_size);
    break;
  case EHTokSwitch:
    this_local._7_1_ =
         acceptSwitchStatement
                   (this,(TIntermNode **)
                         attributes.
                         super_list<glslang::TAttributeArgs,_glslang::pool_allocator<glslang::TAttributeArgs>_>
                         .
                         super__List_base<glslang::TAttributeArgs,_glslang::pool_allocator<glslang::TAttributeArgs>_>
                         ._M_impl._M_node._M_size,(TAttributes *)local_40);
    break;
  case EHTokCase:
    this_local._7_1_ =
         acceptCaseLabel(this,(TIntermNode **)
                              attributes.
                              super_list<glslang::TAttributeArgs,_glslang::pool_allocator<glslang::TAttributeArgs>_>
                              .
                              super__List_base<glslang::TAttributeArgs,_glslang::pool_allocator<glslang::TAttributeArgs>_>
                              ._M_impl._M_node._M_size);
    break;
  case EHTokDefault:
    this_local._7_1_ =
         acceptDefaultLabel(this,(TIntermNode **)
                                 attributes.
                                 super_list<glslang::TAttributeArgs,_glslang::pool_allocator<glslang::TAttributeArgs>_>
                                 .
                                 super__List_base<glslang::TAttributeArgs,_glslang::pool_allocator<glslang::TAttributeArgs>_>
                                 ._M_impl._M_node._M_size);
    break;
  case EHTokLeftBrace:
    this_local._7_1_ =
         acceptScopedCompoundStatement
                   (this,(TIntermNode **)
                         attributes.
                         super_list<glslang::TAttributeArgs,_glslang::pool_allocator<glslang::TAttributeArgs>_>
                         .
                         super__List_base<glslang::TAttributeArgs,_glslang::pool_allocator<glslang::TAttributeArgs>_>
                         ._M_impl._M_node._M_size);
    break;
  case EHTokRightBrace:
    this_local._7_1_ = false;
  }
  TList<glslang::TAttributeArgs>::~TList((TList<glslang::TAttributeArgs> *)local_40);
  return this_local._7_1_;
}

Assistant:

bool HlslGrammar::acceptStatement(TIntermNode*& statement)
{
    statement = nullptr;

    // attributes
    TAttributes attributes;
    acceptAttributes(attributes);

    // attributed_statement
    switch (peek()) {
    case EHTokLeftBrace:
        return acceptScopedCompoundStatement(statement);

    case EHTokIf:
        return acceptSelectionStatement(statement, attributes);

    case EHTokSwitch:
        return acceptSwitchStatement(statement, attributes);

    case EHTokFor:
    case EHTokDo:
    case EHTokWhile:
        return acceptIterationStatement(statement, attributes);

    case EHTokContinue:
    case EHTokBreak:
    case EHTokDiscard:
    case EHTokReturn:
        return acceptJumpStatement(statement);

    case EHTokCase:
        return acceptCaseLabel(statement);
    case EHTokDefault:
        return acceptDefaultLabel(statement);

    case EHTokRightBrace:
        // Performance: not strictly necessary, but stops a bunch of hunting early,
        // and is how sequences of statements end.
        return false;

    default:
        return acceptSimpleStatement(statement);
    }

    return true;
}